

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
               (void)

{
  uint *__args_2;
  pointer puVar1;
  _Base_ptr p_Var2;
  Column_settings *pCVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  pointer __args;
  undefined4 local_534;
  undefined4 *local_530;
  _Base_ptr local_528;
  undefined **local_520;
  ulong local_518;
  shared_count sStack_510;
  undefined4 **local_508;
  undefined8 local_500;
  uint local_4f8 [2];
  undefined8 *local_4f0;
  _Base_ptr *local_4e8;
  undefined1 local_4e0 [8];
  undefined8 local_4d8;
  shared_count sStack_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined **local_4b8;
  char *local_4b0;
  undefined8 *local_4a8;
  char *local_4a0;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = m.matrix_.super_RU_pairing_option.barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __args_2 = &__args->death;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,&__args->dim,&__args->birth,__args_2);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,&__args->dim,&__args->birth,__args_2);
      local_4f8[0] = *__args_2;
      local_500._0_4_ = __args->dim;
      local_500._4_4_ = __args->birth;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_500,(uint *)((long)&local_500 + 4),local_4f8);
      __args = __args + 1;
    } while (__args != m.matrix_.super_RU_pairing_option.barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x574);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_528 = (_Base_ptr)&p_Var2[1]._M_parent;
  local_530 = &local_534;
  local_534 = 0;
  local_4e0[0] = *(int *)&p_Var2[1]._M_parent == 0;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4e8 = &local_528;
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_518 = local_518 & 0xffffffffffffff00;
  local_508 = &local_530;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x575);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 0;
  local_4e0[0] = *(int *)&p_Var2[1].field_0x4 == 0;
  local_528 = (_Base_ptr)&p_Var2[1].field_0x4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x577);
  local_528 = p_Var2 + 1;
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 0xffffffff;
  local_4e0[0] = local_528->_M_color == ~_S_red;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x579);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 0;
  local_4e0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_528 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x57a);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 1;
  local_4e0[0] = *(int *)&p_Var5[1].field_0x4 == 1;
  local_528 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x57b);
  local_528 = p_Var5 + 1;
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 3;
  local_4e0[0] = local_528->_M_color == 3;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x57d);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 0;
  local_4e0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_528 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x57e);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 2;
  local_4e0[0] = *(int *)&p_Var5[1].field_0x4 == 2;
  local_528 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x57f);
  local_528 = p_Var5 + 1;
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 4;
  local_4e0[0] = local_528->_M_color == 4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x581);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 0;
  local_4e0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_528 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x582);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 7;
  local_4e0[0] = *(int *)&p_Var5[1].field_0x4 == 7;
  local_528 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x583);
  local_528 = p_Var5 + 1;
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 8;
  local_4e0[0] = local_528->_M_color == 8;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x585);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 1;
  local_4e0[0] = *(int *)&p_Var5[1]._M_parent == 1;
  local_528 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x586);
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 5;
  local_4e0[0] = *(int *)&p_Var5[1].field_0x4 == 5;
  local_528 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x587);
  local_528 = p_Var5 + 1;
  local_4b0 = (char *)((ulong)local_4b0 & 0xffffffffffffff00);
  local_4b8 = &PTR__lazy_ostream_00240f68;
  local_4a8 = &boost::unit_test::lazy_ostream::inst;
  local_4a0 = "";
  local_534 = 6;
  local_4e0[0] = local_528->_M_color == 6;
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00240f28;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_528;
  local_530 = &local_534;
  local_518 = local_518 & 0xffffffffffffff00;
  local_520 = &PTR__lazy_ostream_00240f28;
  sStack_510.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_508 = &local_530;
  boost::test_tools::tt_detail::report_assertion
            (local_4e0,&local_4b8,&local_4c8,0x587,1,2,2,"std::get<2>(*it)",&local_500,"6",
             &local_520);
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x589);
  local_520 = (undefined **)
              CONCAT71(local_520._1_7_,
                       (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_4b8 = (undefined **)0x2041fc;
  local_4b0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00241168;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_4e8 = (_Base_ptr *)&local_4b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_520 = (undefined **)CONCAT71(local_520._1_7_,bVar4);
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_4b8 = (undefined **)0x20420e;
  local_4b0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00241168;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_4e8 = (_Base_ptr *)&local_4b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_520 = (undefined **)CONCAT71(local_520._1_7_,bVar4);
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_4b8 = (undefined **)0x20421d;
  local_4b0 = "";
  local_4f8[0] = local_4f8[0] & 0xffffff00;
  local_500 = &PTR__lazy_ostream_00241168;
  local_4f0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = (_Base_ptr *)&local_4b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar3 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
    operator_delete(pCVar3,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}